

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcPile::IfcPile(IfcPile *this)

{
  IfcPile *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1a0,"IfcPile");
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00fdd610);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPile,_2UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPile,_2UL>,
             &PTR_construction_vtable_24__00fdd748);
  *(undefined8 *)this = 0xfdd4e0;
  *(undefined8 *)&this->field_0x1a0 = 0xfdd5f8;
  *(undefined8 *)&this->field_0x88 = 0xfdd508;
  *(undefined8 *)&this->field_0x98 = 0xfdd530;
  *(undefined8 *)&this->field_0xd0 = 0xfdd558;
  *(undefined8 *)&this->field_0x100 = 0xfdd580;
  *(undefined8 *)&this->field_0x138 = 0xfdd5a8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPile,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0xfdd5d0;
  std::__cxx11::string::string
            ((string *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPile,_2UL>).field_0x10
            );
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->ConstructionType);
  return;
}

Assistant:

IfcPile() : Object("IfcPile") {}